

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O3

void GPU_GetDefaultRendererOrder(int *order_size,GPU_RendererID *order)

{
  long lVar1;
  GPU_RendererID *pGVar2;
  byte bVar3;
  GPU_RendererID default_order [10];
  GPU_RendererID local_130;
  GPU_RendererID local_118;
  char *local_100;
  GPU_RendererEnum GStack_f8;
  int iStack_f4;
  int local_f0;
  undefined4 uStack_ec;
  char *local_e8;
  GPU_RendererEnum GStack_e0;
  int iStack_dc;
  int local_d8;
  undefined4 uStack_d4;
  char *local_d0;
  GPU_RendererEnum GStack_c8;
  int iStack_c4;
  int local_c0;
  undefined4 uStack_bc;
  
  bVar3 = 0;
  GPU_MakeRendererID(&local_118,"OpenGL 4",5,4,0);
  GPU_MakeRendererID(&local_130,"OpenGL 3",4,3,0);
  local_f0 = local_130.minor_version;
  uStack_ec = local_130._20_4_;
  local_100 = local_130.name;
  GStack_f8 = local_130.renderer;
  iStack_f4 = local_130.major_version;
  GPU_MakeRendererID(&local_130,"OpenGL 2",3,2,0);
  local_d8 = local_130.minor_version;
  uStack_d4 = local_130._20_4_;
  local_e8 = local_130.name;
  GStack_e0 = local_130.renderer;
  iStack_dc = local_130.major_version;
  GPU_MakeRendererID(&local_130,"OpenGL 1",2,1,1);
  local_c0 = local_130.minor_version;
  uStack_bc = local_130._20_4_;
  local_d0 = local_130.name;
  GStack_c8 = local_130.renderer;
  iStack_c4 = local_130.major_version;
  if (order_size != (int *)0x0) {
    *order_size = 4;
  }
  if (order != (GPU_RendererID *)0x0) {
    pGVar2 = &local_118;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      order->name = pGVar2->name;
      pGVar2 = (GPU_RendererID *)((long)pGVar2 + ((ulong)bVar3 * -2 + 1) * 8);
      order = (GPU_RendererID *)((long)order + (ulong)bVar3 * -0x10 + 8);
    }
  }
  return;
}

Assistant:

void GPU_GetDefaultRendererOrder(int* order_size, GPU_RendererID* order)
{
    int count = 0;
    GPU_RendererID default_order[GPU_RENDERER_ORDER_MAX];
    
    #ifndef SDL_GPU_DISABLE_GLES
        #ifndef SDL_GPU_DISABLE_GLES_3
            default_order[count++] = GPU_MakeRendererID("OpenGLES 3", GPU_RENDERER_GLES_3, 3, 0);
        #endif
        #ifndef SDL_GPU_DISABLE_GLES_2
            default_order[count++] = GPU_MakeRendererID("OpenGLES 2", GPU_RENDERER_GLES_2, 2, 0);
        #endif
        #ifndef SDL_GPU_DISABLE_GLES_1
            default_order[count++] = GPU_MakeRendererID("OpenGLES 1", GPU_RENDERER_GLES_1, 1, 1);
        #endif
    #endif
    
    #ifndef SDL_GPU_DISABLE_OPENGL
        #ifdef __MACOSX__
        
            // My understanding of OS X OpenGL support:
            // OS X 10.9: GL 2.1, 3.3, 4.1
            // OS X 10.7: GL 2.1, 3.2
            // OS X 10.6: GL 1.4, 2.1
            #ifndef SDL_GPU_DISABLE_OPENGL_4
            default_order[count++] = GPU_MakeRendererID("OpenGL 4", GPU_RENDERER_OPENGL_4, 4, 1);
            #endif
            #ifndef SDL_GPU_DISABLE_OPENGL_3
            default_order[count++] = GPU_MakeRendererID("OpenGL 3", GPU_RENDERER_OPENGL_3, 3, 2);
            #endif
        
        #else
        
            #ifndef SDL_GPU_DISABLE_OPENGL_4
            default_order[count++] = GPU_MakeRendererID("OpenGL 4", GPU_RENDERER_OPENGL_4, 4, 0);
            #endif
            #ifndef SDL_GPU_DISABLE_OPENGL_3
            default_order[count++] = GPU_MakeRendererID("OpenGL 3", GPU_RENDERER_OPENGL_3, 3, 0);
            #endif
            
        #endif
        
        #ifndef SDL_GPU_DISABLE_OPENGL_2
        default_order[count++] = GPU_MakeRendererID("OpenGL 2", GPU_RENDERER_OPENGL_2, 2, 0);
        #endif
        #ifndef SDL_GPU_DISABLE_OPENGL_1
        default_order[count++] = GPU_MakeRendererID("OpenGL 1", GPU_RENDERER_OPENGL_1, 1, 1);
        #endif
        
    #endif
    
    if(order_size != NULL)
        *order_size = count;
    
    if(order != NULL && count > 0)
        memcpy(order, default_order, count*sizeof(GPU_RendererID));
}